

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  int *piVar1;
  float *scanline;
  byte bVar2;
  char cVar3;
  byte bVar4;
  short sVar5;
  ushort uVar6;
  ImFontConfig *pIVar7;
  ImFont *pIVar8;
  ImFontAtlas *pIVar9;
  ushort *puVar10;
  uchar *puVar11;
  long lVar12;
  stbrp_node *psVar13;
  ImGuiContext *pIVar14;
  stbtt__edge *psVar15;
  undefined8 uVar16;
  ushort uVar17;
  short sVar18;
  stbtt_uint32 sVar19;
  stbtt_uint32 sVar20;
  stbtt_uint32 sVar21;
  stbtt_uint32 sVar22;
  stbtt_uint32 sVar23;
  stbtt_uint32 sVar24;
  stbtt_uint32 sVar25;
  uint uVar26;
  uint uVar27;
  stbtt__active_edge *z;
  void *pvVar28;
  ulong uVar29;
  stbrp_context *psVar30;
  stbrp_node *psVar31;
  uchar *puVar32;
  void *pvVar33;
  stbtt__point *points;
  stbtt__edge *p_00;
  float *pfVar34;
  undefined1 auVar35 [8];
  undefined8 *puVar36;
  stbtt__active_edge *psVar37;
  float *pfVar38;
  Glyph *pGVar39;
  Glyph *pGVar40;
  ushort uVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  int iVar45;
  ulong uVar46;
  stbtt__active_edge *psVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  size_t __n;
  ushort uVar52;
  stbtt_fontinfo *psVar53;
  uchar uVar54;
  uint uVar55;
  long lVar56;
  undefined8 *puVar57;
  ImFontConfig *pIVar58;
  size_t sVar59;
  byte *pbVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  ulong uVar65;
  bool bVar66;
  int iVar67;
  void *pvVar68;
  stbtt_uint32 sVar69;
  void *p;
  short *psVar70;
  stbtt__active_edge *psVar71;
  stbtt__edge *psVar72;
  stbtt_uint8 *data;
  byte *pbVar73;
  long lVar74;
  bool bVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float in_XMM2_Da;
  float fVar83;
  float fVar84;
  float in_XMM3_Da;
  float fVar85;
  float fVar86;
  float y0_2;
  int y0;
  int ix0;
  stbtt_pack_context spc;
  int x1;
  ImVector<stbrp_rect> extra_rects;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  uint local_470;
  undefined1 local_3d0 [8];
  undefined1 local_3c8 [16];
  void *local_3b0;
  void *local_3a8;
  uchar *local_3a0;
  int local_394;
  stbtt_fontinfo *local_390;
  undefined8 *local_388;
  float local_37c;
  float local_378;
  uint local_374;
  stbtt_pack_context local_370;
  void *local_338;
  void *local_330;
  void *local_328;
  undefined8 local_320;
  ImVector<stbrp_rect> local_318;
  long local_308;
  stbtt__point *local_300;
  uint local_2f4;
  uint local_2f0;
  float local_2ec;
  float local_2e8;
  uint local_2e4;
  uint local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  long local_2d0;
  uchar *local_2c8;
  float *local_2c0;
  float local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  short *local_278;
  long local_270;
  long local_268;
  long local_260;
  size_t local_258;
  size_t local_250;
  ulong local_248;
  int local_240;
  int local_23c;
  undefined8 local_238;
  int local_230;
  
  if ((this->ConfigData).Size < 1) {
    __assert_fail("ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x4e1,"bool ImFontAtlas::Build()");
  }
  uVar26 = 0;
  this->TexID = (void *)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  pIVar14 = GImGui;
  iVar45 = (this->ConfigData).Size;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pvVar28 = (*(pIVar14->IO).MemAllocFn)((long)iVar45 * 0x50);
  uVar29 = (ulong)(this->ConfigData).Size;
  bVar75 = (long)uVar29 < 1;
  if ((long)uVar29 < 1) {
    iVar45 = 0;
  }
  else {
    pIVar7 = (this->ConfigData).Data;
    uVar65 = 0;
    iVar45 = 0;
    uVar26 = 0;
    do {
      pIVar8 = pIVar7[uVar65].DstFont;
      if ((pIVar8 == (ImFont *)0x0) ||
         (pIVar9 = pIVar8->ContainerAtlas, pIVar9 != this && pIVar9 != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                      ,0x4f9,"bool ImFontAtlas::Build()");
      }
      pIVar58 = pIVar7 + uVar65;
      pbVar73 = (byte *)pIVar58->FontData;
      iVar43 = pIVar58->FontNo;
      bVar2 = *pbVar73;
      sVar69 = 0xffffffff;
      if (bVar2 < 0x4f) {
        if (bVar2 == 0) {
          if (((pbVar73[1] == 1) && (pbVar73[2] == 0)) && (pbVar73[3] == 0)) {
LAB_0015121a:
            sVar69 = -(uint)(iVar43 != 0);
          }
        }
        else if (bVar2 == 0x31) {
          if (((pbVar73[1] != 0) || (pbVar73[2] != 0)) || (pbVar73[3] != 0)) goto LAB_0015116a;
          goto LAB_0015121a;
        }
      }
      else {
LAB_0015116a:
        if (bVar2 == 0x4f) {
          if (((pbVar73[1] == 0x54) && (pbVar73[2] == 0x54)) && (pbVar73[3] == 0x4f))
          goto LAB_0015121a;
        }
        else if (bVar2 == 0x74) {
          if (((pbVar73[1] == 0x79) && (pbVar73[2] == 0x70)) && (pbVar73[3] == 0x31))
          goto LAB_0015121a;
          if (((pbVar73[1] == 0x74) && (pbVar73[2] == 99)) && (pbVar73[3] == 0x66)) {
            uVar42 = *(uint *)(pbVar73 + 4);
            uVar42 = uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8 |
                     uVar42 << 0x18;
            if (((uVar42 == 0x20000) || (uVar42 == 0x10000)) &&
               (uVar42 = *(uint *)(pbVar73 + 8),
               iVar43 < (int)(uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8 |
                             uVar42 << 0x18))) {
              uVar42 = *(uint *)(pbVar73 + (long)iVar43 * 4 + 0xc);
              sVar69 = uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8 |
                       uVar42 << 0x18;
            }
          }
        }
      }
      local_3c8._0_8_ = pIVar58;
      if ((int)sVar69 < 0) {
        __assert_fail("font_offset >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                      ,0x4fb,"bool ImFontAtlas::Build()");
      }
      *(byte **)((long)pvVar28 + uVar65 * 0x50 + 8) = pbVar73;
      *(stbtt_uint32 *)((long)pvVar28 + uVar65 * 0x50 + 0x10) = sVar69;
      sVar19 = stbtt__find_table(pbVar73,sVar69,"cmap");
      sVar20 = stbtt__find_table(pbVar73,sVar69,"loca");
      *(stbtt_uint32 *)((long)pvVar28 + uVar65 * 0x50 + 0x18) = sVar20;
      sVar21 = stbtt__find_table(pbVar73,sVar69,"head");
      *(stbtt_uint32 *)((long)pvVar28 + uVar65 * 0x50 + 0x1c) = sVar21;
      sVar22 = stbtt__find_table(pbVar73,sVar69,"glyf");
      *(stbtt_uint32 *)((long)pvVar28 + uVar65 * 0x50 + 0x20) = sVar22;
      sVar23 = stbtt__find_table(pbVar73,sVar69,"hhea");
      *(stbtt_uint32 *)((long)pvVar28 + uVar65 * 0x50 + 0x24) = sVar23;
      sVar24 = stbtt__find_table(pbVar73,sVar69,"hmtx");
      *(stbtt_uint32 *)((long)pvVar28 + uVar65 * 0x50 + 0x28) = sVar24;
      sVar25 = stbtt__find_table(pbVar73,sVar69,"kern");
      *(stbtt_uint32 *)((long)pvVar28 + uVar65 * 0x50 + 0x2c) = sVar25;
      bVar66 = true;
      if (((((sVar19 != 0) && (sVar20 != 0)) && (sVar21 != 0)) && ((sVar22 != 0 && (sVar23 != 0))))
         && (sVar24 != 0)) {
        sVar69 = stbtt__find_table(pbVar73,sVar69,"maxp");
        if (sVar69 == 0) {
          uVar42 = 0xffff;
        }
        else {
          uVar42 = (uint)(ushort)(*(ushort *)(pbVar73 + (ulong)sVar69 + 4) << 8 |
                                 *(ushort *)(pbVar73 + (ulong)sVar69 + 4) >> 8);
        }
        *(uint *)((long)pvVar28 + uVar65 * 0x50 + 0x14) = uVar42;
        uVar17 = *(ushort *)(pbVar73 + (ulong)sVar19 + 2) << 8 |
                 *(ushort *)(pbVar73 + (ulong)sVar19 + 2) >> 8;
        *(undefined4 *)((long)pvVar28 + uVar65 * 0x50 + 0x30) = 0;
        bVar66 = true;
        if (uVar17 != 0) {
          uVar42 = sVar19 + 4;
          uVar46 = (ulong)uVar17;
          do {
            uVar17 = *(ushort *)(pbVar73 + uVar42) << 8 | *(ushort *)(pbVar73 + uVar42) >> 8;
            if ((uVar17 == 0) ||
               ((uVar17 == 3 &&
                ((uVar17 = *(ushort *)(pbVar73 + (ulong)uVar42 + 2) << 8 |
                           *(ushort *)(pbVar73 + (ulong)uVar42 + 2) >> 8, uVar17 == 10 ||
                 (uVar17 == 1)))))) {
              uVar55 = *(uint *)(pbVar73 + (ulong)uVar42 + 4);
              *(uint *)((long)pvVar28 + uVar65 * 0x50 + 0x30) =
                   (uVar55 >> 0x18 | (uVar55 & 0xff0000) >> 8 | (uVar55 & 0xff00) << 8 |
                   uVar55 << 0x18) + sVar19;
            }
            uVar42 = uVar42 + 8;
            uVar46 = uVar46 - 1;
          } while (uVar46 != 0);
        }
        if (*(int *)((long)pvVar28 + uVar65 * 0x50 + 0x30) != 0) {
          *(uint *)((long)pvVar28 + uVar65 * 0x50 + 0x34) =
               (uint)(ushort)(*(ushort *)(pbVar73 + (long)(int)sVar21 + 0x32) << 8 |
                             *(ushort *)(pbVar73 + (long)(int)sVar21 + 0x32) >> 8);
          bVar66 = false;
        }
      }
      if (!bVar66) {
        if (*(long *)(local_3c8._0_8_ + 0x30) == 0) {
          *(ImWchar **)(local_3c8._0_8_ + 0x30) = GetGlyphRangesDefault::ranges;
        }
        uVar17 = **(ushort **)(local_3c8._0_8_ + 0x30);
        puVar10 = *(ushort **)(local_3c8._0_8_ + 0x30);
        while (uVar17 != 0) {
          if (puVar10[1] == 0) break;
          iVar45 = (iVar45 - (uint)uVar17) + (uint)puVar10[1] + 1;
          uVar26 = uVar26 + 1;
          uVar17 = puVar10[2];
          puVar10 = puVar10 + 2;
        }
      }
      if (bVar66) break;
      uVar65 = uVar65 + 1;
      bVar75 = uVar29 <= uVar65;
    } while (uVar65 != uVar29);
  }
  if (bVar75 != false) {
    uVar42 = this->TexDesiredWidth;
    if ((((int)uVar42 < 1) && (uVar42 = 0x1000, iVar45 < 0xfa1)) && (uVar42 = 0x800, iVar45 < 0x7d1)
       ) {
      uVar42 = (uint)(1000 < iVar45) * 0x200 + 0x200;
    }
    this->TexWidth = uVar42;
    this->TexHeight = 0;
    pIVar14 = GImGui;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    psVar30 = (stbrp_context *)(*(pIVar14->IO).MemAllocFn)(0x48);
    pIVar14 = GImGui;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    psVar31 = (stbrp_node *)(*(pIVar14->IO).MemAllocFn)((long)(int)uVar42 * 0x10 - 0x10);
    pIVar14 = GImGui;
    if ((psVar30 == (stbrp_context *)0x0) || (psVar31 == (stbrp_node *)0x0)) {
      if (psVar30 != (stbrp_context *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
        (*(pIVar14->IO).MemFreeFn)(psVar30);
      }
      pIVar14 = GImGui;
      if (psVar31 != (stbrp_node *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
        (*(pIVar14->IO).MemFreeFn)(psVar31);
      }
    }
    else {
      local_370.user_allocator_context = (void *)0x0;
      local_370.height = 0x8000;
      local_370.pixels = (uchar *)0x0;
      local_370.padding = 1;
      local_370.h_oversample = 1;
      local_370.v_oversample = 1;
      local_370.pack_info = psVar30;
      local_370.width = uVar42;
      local_370.stride_in_bytes = uVar42;
      local_370.nodes = psVar31;
      if (0x10000 < uVar42) {
        __assert_fail("width <= 0xffff && height <= 0xffff",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_rect_pack.h"
                      ,0xf2,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
      }
      iVar43 = uVar42 - 1;
      if (uVar42 < 3) {
        uVar29 = 0;
      }
      else {
        uVar29 = 0;
        psVar13 = psVar31;
        do {
          uVar29 = uVar29 + 1;
          psVar13->next = psVar13 + 1;
          psVar13 = psVar13 + 1;
        } while (uVar42 - 2 != uVar29);
      }
      psVar31[uVar29].next = (stbrp_node *)0x0;
      psVar30->init_mode = 1;
      psVar30->heuristic = 0;
      psVar30->free_head = psVar31;
      psVar30->active_head = psVar30->extra;
      psVar30->width = iVar43;
      psVar30->height = 0x7fff;
      psVar30->num_nodes = iVar43;
      psVar30->align = (int)(uVar42 + iVar43 + -2) / iVar43;
      psVar30->extra[0].x = 0;
      psVar30->extra[0].y = 0;
      psVar30->extra[0].next = psVar30->extra + 1;
      psVar30->extra[1].x = (stbrp_coord)iVar43;
      psVar30->extra[1].y = 0xffff;
      psVar30->extra[1].next = (stbrp_node *)0x0;
    }
    local_318.Size = 0;
    local_318.Capacity = 0;
    local_318.Data = (stbrp_rect *)0x0;
    RenderCustomTexData(this,0,&local_318);
    local_370.h_oversample = 1;
    local_370.v_oversample = 1;
    if (local_318.Size < 1) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x353,"value_type &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]");
    }
    stbrp_pack_rects((stbrp_context *)local_370.pack_info,local_318.Data,local_318.Size);
    if (0 < (long)local_318.Size) {
      iVar43 = this->TexHeight;
      lVar56 = 0;
      do {
        if (*(int *)((long)&(local_318.Data)->was_packed + lVar56) != 0) {
          iVar61 = (uint)*(ushort *)((long)&(local_318.Data)->h + lVar56) +
                   (uint)*(ushort *)((long)&(local_318.Data)->y + lVar56);
          if (iVar43 <= iVar61) {
            iVar43 = iVar61;
          }
          this->TexHeight = iVar43;
        }
        lVar56 = lVar56 + 0x10;
      } while ((long)local_318.Size * 0x10 != lVar56);
    }
    pIVar14 = GImGui;
    sVar59 = (long)iVar45 * 0x1c;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    local_328 = (*(pIVar14->IO).MemAllocFn)(sVar59);
    pIVar14 = GImGui;
    __n = (long)iVar45 << 4;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    local_330 = (*(pIVar14->IO).MemAllocFn)(__n);
    pIVar14 = GImGui;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    local_338 = (*(pIVar14->IO).MemAllocFn)((long)(int)uVar26 * 0x28);
    pvVar33 = local_328;
    memset(local_328,0,sVar59);
    memset(local_330,0,__n);
    memset(local_338,0,(long)(int)uVar26 * 0x28);
    local_470 = 0;
    iVar43 = 0;
    iVar61 = 0;
    if (0 < (this->ConfigData).Size) {
      pvVar68 = (void *)0x0;
      iVar61 = 0;
      iVar43 = 0;
      local_470 = 0;
      do {
        pIVar7 = (this->ConfigData).Data;
        puVar10 = pIVar7[(long)pvVar68].GlyphRanges;
        uVar17 = *puVar10;
        uVar29 = 0;
        iVar63 = 0;
        if (uVar17 != 0) {
          uVar29 = 0;
          iVar63 = 0;
          do {
            if (puVar10[uVar29 * 2 + 1] == 0) break;
            iVar63 = (iVar63 - (uint)uVar17) + (uint)puVar10[uVar29 * 2 + 1] + 1;
            uVar17 = puVar10[uVar29 * 2 + 2];
            uVar29 = uVar29 + 1;
          } while (uVar17 != 0);
        }
        psVar53 = (stbtt_fontinfo *)((long)pvVar68 * 0x50 + (long)pvVar28);
        pfVar34 = (float *)((long)local_338 + (ulong)local_470 * 0x28);
        psVar53[1].data = (uchar *)pfVar34;
        iVar62 = (int)uVar29;
        psVar53[1].fontstart = iVar62;
        if (iVar62 != 0) {
          fVar76 = pIVar7[(long)pvVar68].SizePixels;
          uVar65 = 0;
          do {
            *pfVar34 = fVar76;
            uVar17 = puVar10[uVar65 * 2];
            pfVar34[1] = (float)(uint)uVar17;
            iVar64 = (uint)puVar10[uVar65 * 2 + 1] - (uint)uVar17;
            pfVar34[4] = (float)(iVar64 + 1);
            *(void **)(pfVar34 + 6) = (void *)((long)iVar61 * 0x1c + (long)pvVar33);
            iVar61 = iVar64 + iVar61 + 1;
            uVar65 = uVar65 + 1;
            pfVar34 = pfVar34 + 10;
          } while ((uVar29 & 0xffffffff) != uVar65);
        }
        local_3b0 = (void *)CONCAT44(local_3b0._4_4_,iVar43);
        psVar53[1].userdata = (void *)((long)iVar43 * 0x10 + (long)local_330);
        local_3a8 = pvVar68;
        stbtt_PackSetOversampling
                  (&local_370,pIVar7[(long)pvVar68].OversampleH,pIVar7[(long)pvVar68].OversampleV);
        uVar16 = local_370._32_8_;
        iVar43 = psVar53[1].fontstart;
        if ((long)iVar43 < 1) {
          uVar42 = 0;
        }
        else {
          pvVar33 = psVar53[1].userdata;
          puVar32 = psVar53[1].data;
          uVar65 = local_370._32_8_ & 0xffffffff;
          uVar29 = (ulong)local_370._32_8_ >> 0x20;
          sVar5 = (short)local_370.v_oversample;
          sVar18 = (short)local_370.padding;
          lVar56 = 0;
          uVar42 = 0;
          local_3a0 = puVar32;
          do {
            fVar76 = *(float *)(puVar32 + lVar56 * 0x28);
            if (fVar76 <= 0.0) {
              fVar76 = -fVar76;
              uVar55 = (uint)(ushort)(*(ushort *)(psVar53->data + (long)psVar53->head + 0x12) << 8 |
                                     *(ushort *)(psVar53->data + (long)psVar53->head + 0x12) >> 8);
            }
            else {
              puVar11 = psVar53->data;
              lVar49 = (long)psVar53->hhea;
              uVar55 = ((int)(short)((ushort)puVar11[lVar49 + 4] << 8) | (uint)puVar11[lVar49 + 5])
                       - ((int)(short)((ushort)puVar11[lVar49 + 6] << 8) | (uint)puVar11[lVar49 + 7]
                         );
            }
            puVar32[lVar56 * 0x28 + 0x20] = (uchar)uVar65;
            puVar32[lVar56 * 0x28 + 0x21] = SUB81(uVar16,4);
            if (0 < *(int *)(puVar32 + lVar56 * 0x28 + 0x10)) {
              local_3c8._0_8_ = lVar56;
              psVar70 = (short *)((long)pvVar33 + (long)(int)uVar42 * 0x10 + 6);
              lVar49 = 0;
              do {
                if (*(long *)(puVar32 + lVar56 * 0x28 + 8) == 0) {
                  iVar64 = *(int *)(puVar32 + lVar56 * 0x28 + 4) + (int)lVar49;
                }
                else {
                  iVar64 = *(int *)(*(long *)(puVar32 + lVar56 * 0x28 + 8) + lVar49 * 4);
                }
                iVar64 = stbtt_FindGlyphIndex(psVar53,iVar64);
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar53,iVar64,(fVar76 / (float)(int)uVar55) * (float)uVar65,
                           (fVar76 / (float)(int)uVar55) * (float)uVar29,in_XMM2_Da,in_XMM3_Da,
                           (int *)&local_238,(int *)local_3d0,(int *)&local_320,&local_394);
                psVar70[-1] = (((short)(int)local_320 + (short)uVar16) - (short)local_238) + sVar18
                              + -1;
                *psVar70 = ~local_3d0._0_2_ + (short)local_394 + sVar5 + sVar18;
                lVar49 = lVar49 + 1;
                psVar70 = psVar70 + 8;
              } while (lVar49 < *(int *)(puVar32 + lVar56 * 0x28 + 0x10));
              uVar42 = uVar42 + (int)lVar49;
              puVar32 = local_3a0;
              lVar56 = local_3c8._0_8_;
            }
            lVar56 = lVar56 + 1;
          } while (lVar56 != iVar43);
        }
        stbrp_pack_rects((stbrp_context *)local_370.pack_info,(stbrp_rect *)psVar53[1].userdata,
                         uVar42);
        if (0 < (int)uVar42) {
          iVar43 = this->TexHeight;
          pvVar33 = psVar53[1].userdata;
          lVar56 = 0;
          do {
            if (*(int *)((long)pvVar33 + lVar56 + 0xc) != 0) {
              iVar64 = (uint)*(ushort *)((long)pvVar33 + lVar56 + 6) +
                       (uint)*(ushort *)((long)pvVar33 + lVar56 + 10);
              if (iVar43 <= iVar64) {
                iVar43 = iVar64;
              }
              this->TexHeight = iVar43;
            }
            lVar56 = lVar56 + 0x10;
          } while ((ulong)uVar42 << 4 != lVar56);
        }
        local_470 = iVar62 + local_470;
        iVar43 = iVar63 + (int)local_3b0;
        pvVar68 = (void *)((long)local_3a8 + 1);
        pvVar33 = local_328;
      } while ((long)pvVar68 < (long)(this->ConfigData).Size);
    }
    if (iVar43 != iVar45) {
      __assert_fail("buf_rects_n == total_glyph_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                    ,0x54b,"bool ImFontAtlas::Build()");
    }
    if (iVar61 != iVar45) {
      __assert_fail("buf_packedchars_n == total_glyph_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                    ,0x54c,"bool ImFontAtlas::Build()");
    }
    if (local_470 != uVar26) {
      __assert_fail("buf_ranges_n == total_glyph_range_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                    ,0x54d,"bool ImFontAtlas::Build()");
    }
    uVar26 = this->TexHeight - 1;
    uVar26 = (int)uVar26 >> 1 | uVar26;
    uVar26 = (int)uVar26 >> 2 | uVar26;
    uVar26 = (int)uVar26 >> 4 | uVar26;
    uVar26 = (int)uVar26 >> 8 | uVar26;
    lVar56 = (long)(int)((int)uVar26 >> 0x10 | uVar26) + 1;
    this->TexHeight = (int)lVar56;
    pIVar14 = GImGui;
    iVar45 = this->TexWidth;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    puVar32 = (uchar *)(*(pIVar14->IO).MemAllocFn)(iVar45 * lVar56);
    this->TexPixelsAlpha8 = puVar32;
    memset(puVar32,0,(long)this->TexHeight * (long)this->TexWidth);
    local_370.pixels = this->TexPixelsAlpha8;
    local_370.height = this->TexHeight;
    if (0 < (this->ConfigData).Size) {
      lVar56 = 0;
      do {
        pIVar7 = (this->ConfigData).Data;
        lVar49 = lVar56 * 0x50;
        local_390 = (stbtt_fontinfo *)((long)pvVar28 + lVar49);
        local_2a0 = lVar56;
        stbtt_PackSetOversampling(&local_370,pIVar7[lVar56].OversampleH,pIVar7[lVar56].OversampleV);
        local_298 = (long)*(int *)((long)pvVar28 + lVar49 + 0x48);
        local_2f0 = local_370.h_oversample;
        local_2f4 = local_370.v_oversample;
        if (0 < local_298) {
          lVar56 = *(long *)((long)pvVar28 + lVar49 + 0x38);
          local_2d0 = *(long *)((long)pvVar28 + lVar49 + 0x40);
          lVar48 = 0;
          lVar49 = 0;
          local_288 = lVar56;
          do {
            local_2b8 = *(float *)(local_2d0 + lVar48 * 0x28);
            if (local_2b8 <= 0.0) {
              uStack_2b4 = 0x80000000;
              uStack_2b0 = 0x80000000;
              uStack_2ac = 0x80000000;
              local_2b8 = -local_2b8;
              uVar26 = (uint)(ushort)(*(ushort *)(local_390->data + (long)local_390->head + 0x12) <<
                                      8 | *(ushort *)
                                           (local_390->data + (long)local_390->head + 0x12) >> 8);
            }
            else {
              puVar32 = local_390->data;
              lVar50 = (long)local_390->hhea;
              uVar26 = ((int)(short)((ushort)puVar32[lVar50 + 4] << 8) | (uint)puVar32[lVar50 + 5])
                       - ((int)(short)((ushort)puVar32[lVar50 + 6] << 8) | (uint)puVar32[lVar50 + 7]
                         );
              uStack_2b4 = 0;
              uStack_2b0 = 0;
              uStack_2ac = 0;
            }
            local_2b8 = local_2b8 / (float)(int)uVar26;
            lVar50 = local_2d0 + lVar48 * 0x28;
            bVar2 = *(byte *)(lVar50 + 0x20);
            fVar76 = (float)bVar2;
            local_378 = 0.0;
            local_37c = 0.0;
            if (bVar2 != 0) {
              local_37c = (float)(int)(1 - (uint)bVar2) / (fVar76 + fVar76);
            }
            local_370.v_oversample._0_1_ = *(byte *)(lVar50 + 0x21);
            local_370.h_oversample = (uint)bVar2;
            local_370.v_oversample._1_3_ = 0;
            fVar79 = (float)(byte)local_370.v_oversample;
            if ((byte)local_370.v_oversample != 0) {
              local_378 = (float)(int)(1 - (uint)(byte)local_370.v_oversample) / (fVar79 + fVar79);
            }
            local_290 = lVar48;
            if (0 < *(int *)(lVar50 + 0x10)) {
              fVar76 = 1.0 / fVar76;
              local_2ec = 1.0 / fVar79;
              lVar49 = (long)(int)lVar49;
              lVar48 = 0;
              local_2e8 = fVar76;
              local_280 = lVar50;
              do {
                psVar53 = local_390;
                if (*(int *)(lVar56 + 0xc + lVar49 * 0x10) != 0) {
                  if (*(long *)(lVar50 + 8) == 0) {
                    iVar45 = *(int *)(lVar50 + 4) + (int)lVar48;
                  }
                  else {
                    iVar45 = *(int *)(*(long *)(lVar50 + 8) + lVar48 * 4);
                  }
                  lVar56 = lVar49 * 0x10 + lVar56;
                  local_278 = (short *)(lVar48 * 0x1c + *(long *)(lVar50 + 0x18));
                  local_270 = lVar48;
                  local_268 = lVar49;
                  iVar43 = stbtt_FindGlyphIndex(local_390,iVar45);
                  uVar52 = *(short *)(lVar56 + 8) + (short)local_370.padding;
                  *(ushort *)(lVar56 + 8) = uVar52;
                  uVar17 = *(short *)(lVar56 + 10) + (short)local_370.padding;
                  *(ushort *)(lVar56 + 10) = uVar17;
                  uVar26 = *(int *)(lVar56 + 4) - local_370.padding;
                  *(short *)(lVar56 + 4) = (short)uVar26;
                  uVar42 = (uint)*(ushort *)(lVar56 + 6) - local_370.padding;
                  *(short *)(lVar56 + 6) = (short)uVar42;
                  puVar32 = psVar53->data;
                  uVar41 = *(ushort *)(puVar32 + (long)psVar53->hhea + 0x22) << 8 |
                           *(ushort *)(puVar32 + (long)psVar53->hhea + 0x22) >> 8;
                  iVar45 = psVar53->hmtx;
                  lVar49 = (ulong)uVar41 * 4 + (long)iVar45 + -4;
                  lVar48 = (ulong)uVar41 * 4 + (long)iVar45 + -3;
                  if (iVar43 < (int)(uint)uVar41) {
                    lVar49 = (long)(iVar43 * 4) + (long)iVar45;
                    lVar48 = (long)(iVar43 * 4) + 1 + (long)iVar45;
                  }
                  local_2e0 = (uint)puVar32[lVar49];
                  local_2e4 = (uint)puVar32[lVar48];
                  uVar55 = local_370.h_oversample;
                  uVar44 = local_370.v_oversample;
                  fVar77 = (float)(local_370._32_8_ & 0xffffffff) * local_2b8;
                  fVar80 = (float)local_370.v_oversample * local_2b8;
                  fVar79 = local_2b8;
                  local_308 = lVar56;
                  stbtt_GetGlyphBitmapBoxSubpixel
                            (psVar53,iVar43,fVar77,fVar80,local_2b8,fVar76,&local_2d8,&local_2dc,
                             &local_23c,&local_240);
                  local_2c8 = local_370.pixels + uVar52;
                  local_374 = local_370.stride_in_bytes;
                  uVar27 = stbtt_GetGlyphShape(psVar53,iVar43,(stbtt_vertex **)&local_320);
                  uVar55 = (uVar26 & 0xffff) - uVar55;
                  pvVar33 = (void *)(ulong)uVar55;
                  uVar55 = uVar55 + 1;
                  local_3a8 = pvVar33;
                  stbtt_GetGlyphBitmapBoxSubpixel
                            (local_390,iVar43,fVar77,fVar80,fVar79,fVar76,&local_394,&local_2d4,
                             (int *)0x0,(int *)0x0);
                  iVar45 = local_2d4;
                  iVar43 = local_394;
                  pIVar14 = GImGui;
                  if (uVar55 != 0) {
                    uVar44 = (uVar42 & 0xffff) - uVar44;
                    if (uVar44 + 1 != 0) {
                      lVar56 = CONCAT44(local_320._4_4_,(int)local_320);
                      local_238 = local_238 & 0xffffffff00000000;
                      if ((int)uVar27 < 1) {
                        puVar32 = (uchar *)0x0;
                      }
                      else {
                        lVar49 = 0;
                        puVar32 = (uchar *)0x0;
                        do {
                          puVar32 = (uchar *)(ulong)((int)puVar32 +
                                                    (uint)(*(char *)(lVar56 + 8 + lVar49) == '\x01')
                                                    );
                          lVar49 = lVar49 + 10;
                        } while ((ulong)uVar27 * 10 != lVar49);
                      }
                      if ((int)puVar32 == 0) {
LAB_00152368:
                        points = (stbtt__point *)0x0;
                      }
                      else {
                        piVar1 = &(GImGui->IO).MetricsAllocs;
                        *piVar1 = *piVar1 + 1;
                        pvVar33 = (*(pIVar14->IO).MemAllocFn)((long)(int)puVar32 << 2);
                        if (pvVar33 == (void *)0x0) {
                          puVar32 = (uchar *)0x0;
                          goto LAB_00152368;
                        }
                        fVar76 = fVar80;
                        if (fVar77 <= fVar80) {
                          fVar76 = fVar77;
                        }
                        uVar29 = 0;
                        fVar79 = 0.0;
                        points = (stbtt__point *)0x0;
                        local_3a0 = puVar32;
                        do {
                          pIVar14 = GImGui;
                          if ((int)uVar29 == 0) {
LAB_00152185:
                            local_238 = local_238 & 0xffffffff00000000;
                            if ((int)uVar27 < 1) {
                              lVar49 = -1;
                            }
                            else {
                              local_3c8._0_8_ = uVar29;
                              uVar26 = 0xffffffff;
                              fVar81 = 0.0;
                              lVar49 = 0;
                              fVar78 = 0.0;
                              do {
                                cVar3 = *(char *)(lVar56 + 8 + lVar49);
                                if (cVar3 == '\x03') {
                                  stbtt__tesselate_curve
                                            (points,(int *)&local_238,fVar78,fVar81,
                                             (float)(int)*(short *)(lVar56 + 4 + lVar49),
                                             (float)(int)*(short *)(lVar56 + 6 + lVar49),
                                             (float)(int)*(short *)(lVar56 + lVar49),
                                             (float)(int)*(short *)(lVar56 + 2 + lVar49),
                                             (0.35 / fVar76) * (0.35 / fVar76),0);
                                  fVar78 = (float)(int)*(short *)(lVar56 + lVar49);
                                  fVar81 = (float)(int)*(short *)(lVar56 + 2 + lVar49);
                                  uVar29 = local_238;
                                }
                                else {
                                  if (cVar3 == '\x02') {
                                    sVar5 = *(short *)(lVar56 + lVar49);
                                    sVar18 = *(short *)(lVar56 + 2 + lVar49);
                                  }
                                  else {
                                    uVar29 = local_238;
                                    if (cVar3 != '\x01') goto LAB_001522c8;
                                    if (-1 < (int)uVar26) {
                                      *(int *)((long)pvVar33 + (ulong)uVar26 * 4) =
                                           (int)(float)local_238 - (int)fVar79;
                                    }
                                    uVar26 = uVar26 + 1;
                                    sVar5 = *(short *)(lVar56 + lVar49);
                                    sVar18 = *(short *)(lVar56 + 2 + lVar49);
                                    fVar79 = (float)local_238;
                                  }
                                  uVar29 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
                                  fVar81 = (float)(int)sVar18;
                                  fVar78 = (float)(int)sVar5;
                                  if (points != (stbtt__point *)0x0) {
                                    points[(int)(float)local_238].x = fVar78;
                                    points[(int)(float)local_238].y = fVar81;
                                  }
                                }
LAB_001522c8:
                                local_238 = uVar29;
                                lVar49 = lVar49 + 10;
                              } while ((ulong)uVar27 * 10 != lVar49);
                              lVar49 = (long)(int)uVar26;
                              uVar29 = local_3c8._0_8_;
                            }
                            *(int *)((long)pvVar33 + lVar49 * 4) =
                                 (int)(float)local_238 - (int)fVar79;
                            bVar66 = true;
                          }
                          else {
                            piVar1 = &(GImGui->IO).MetricsAllocs;
                            *piVar1 = *piVar1 + 1;
                            points = (stbtt__point *)
                                     (*(pIVar14->IO).MemAllocFn)((long)(int)(float)local_238 << 3);
                            if (points != (stbtt__point *)0x0) goto LAB_00152185;
                            points = (stbtt__point *)0x0;
                            bVar66 = false;
                          }
                          if (!bVar66) {
                            if (points != (stbtt__point *)0x0) {
                              piVar1 = &(GImGui->IO).MetricsAllocs;
                              *piVar1 = *piVar1 + -1;
                            }
                            (*(GImGui->IO).MemFreeFn)(points);
                            pIVar14 = GImGui;
                            piVar1 = &(GImGui->IO).MetricsAllocs;
                            *piVar1 = *piVar1 + -1;
                            (*(pIVar14->IO).MemFreeFn)(pvVar33);
                            puVar32 = (uchar *)0x0;
                            pvVar33 = (void *)0x0;
                            goto LAB_00152368;
                          }
                          iVar61 = (int)uVar29;
                          uVar29 = (ulong)(iVar61 + 1);
                          puVar32 = local_3a0;
                        } while (iVar61 == 0);
                      }
                      pIVar14 = GImGui;
                      local_300 = points;
                      if (points != (stbtt__point *)0x0) {
                        if ((int)puVar32 < 1) {
                          sVar59 = 0x14;
                        }
                        else {
                          uVar29 = 0;
                          lVar56 = 0;
                          do {
                            lVar56 = (long)(int)lVar56 + (long)*(int *)((long)pvVar33 + uVar29 * 4);
                            uVar29 = uVar29 + 1;
                          } while (((ulong)puVar32 & 0xffffffff) != uVar29);
                          sVar59 = lVar56 * 0x14 + 0x14;
                        }
                        piVar1 = &(GImGui->IO).MetricsAllocs;
                        *piVar1 = *piVar1 + 1;
                        p_00 = (stbtt__edge *)(*(pIVar14->IO).MemAllocFn)(sVar59);
                        if (p_00 != (stbtt__edge *)0x0) {
                          if ((int)puVar32 < 1) {
                            uVar26 = 0;
                          }
                          else {
                            uVar29 = 0;
                            uVar26 = 0;
                            iVar61 = 0;
                            do {
                              iVar63 = *(int *)((long)pvVar33 + uVar29 * 4);
                              if (0 < iVar63) {
                                uVar46 = (ulong)(iVar63 - 1);
                                uVar65 = 0;
                                do {
                                  iVar62 = (int)uVar46;
                                  fVar76 = local_300[(long)iVar61 + (long)iVar62].y;
                                  fVar79 = local_300[(long)iVar61 + uVar65].y;
                                  if ((fVar76 != fVar79) || (NAN(fVar76) || NAN(fVar79))) {
                                    iVar67 = (int)uVar65;
                                    iVar64 = iVar62;
                                    if (fVar76 <= fVar79) {
                                      iVar64 = iVar67;
                                      iVar67 = iVar62;
                                    }
                                    p_00[(int)uVar26].invert = (uint)(fVar79 < fVar76);
                                    p_00[(int)uVar26].x0 =
                                         local_300[(long)iVar61 + (long)iVar64].x * fVar77 + 0.0;
                                    p_00[(int)uVar26].y0 =
                                         local_300[(long)iVar61 + (long)iVar64].y * -fVar80 + 0.0;
                                    p_00[(int)uVar26].x1 =
                                         local_300[(long)iVar61 + (long)iVar67].x * fVar77 + 0.0;
                                    p_00[(int)uVar26].y1 =
                                         local_300[(long)iVar61 + (long)iVar67].y * -fVar80 + 0.0;
                                    uVar26 = uVar26 + 1;
                                  }
                                  uVar46 = uVar65 & 0xffffffff;
                                  uVar65 = uVar65 + 1;
                                } while ((long)uVar65 < (long)*(int *)((long)pvVar33 + uVar29 * 4));
                              }
                              iVar61 = iVar61 + iVar63;
                              uVar29 = uVar29 + 1;
                            } while (uVar29 != ((ulong)puVar32 & 0xffffffff));
                          }
                          stbtt__sort_edges_quicksort(p_00,uVar26);
                          if (1 < (int)uVar26) {
                            uVar29 = 1;
                            do {
                              fVar76 = p_00[uVar29].x0;
                              fVar79 = p_00[uVar29].y0;
                              local_230 = p_00[uVar29].invert;
                              local_238._0_4_ = p_00[uVar29].x1;
                              local_238._4_4_ = p_00[uVar29].y1;
                              uVar65 = uVar29 & 0xffffffff;
                              do {
                                uVar42 = (uint)uVar65;
                                if ((int)uVar42 < 1) break;
                                fVar77 = p_00[uVar65 - 1].y0;
                                if (fVar79 < fVar77) {
                                  psVar72 = p_00 + uVar65;
                                  psVar72->invert = psVar72[-1].invert;
                                  fVar80 = psVar72[-1].y0;
                                  fVar78 = psVar72[-1].x1;
                                  fVar81 = psVar72[-1].y1;
                                  psVar72->x0 = psVar72[-1].x0;
                                  psVar72->y0 = fVar80;
                                  psVar72->x1 = fVar78;
                                  psVar72->y1 = fVar81;
                                  uVar65 = (ulong)(uVar42 - 1);
                                }
                                uVar42 = (uint)uVar65;
                              } while (fVar79 < fVar77);
                              if (uVar29 != uVar42) {
                                p_00[(int)uVar42].x0 = fVar76;
                                p_00[(int)uVar42].y0 = fVar79;
                                p_00[(int)uVar42].x1 = (float)local_238;
                                p_00[(int)uVar42].y1 = (float)local_238._4_4_;
                                p_00[(int)uVar42].invert = local_230;
                              }
                              uVar29 = uVar29 + 1;
                            } while (uVar29 != uVar26);
                          }
                          pIVar14 = GImGui;
                          local_3d0 = (undefined1  [8])0x0;
                          pfVar34 = (float *)&local_238;
                          if (0x40 < (int)uVar55) {
                            piVar1 = &(GImGui->IO).MetricsAllocs;
                            *piVar1 = *piVar1 + 1;
                            pfVar34 = (float *)(*(pIVar14->IO).MemAllocFn)((ulong)uVar55 * 8 + 4);
                          }
                          p_00[(int)uVar26].y0 = (float)(int)(uVar44 + 1 + iVar45) + 1.0;
                          if (uVar44 < 0x7fffffff) {
                            local_2c8 = local_2c8 + (int)(uVar17 * local_374);
                            local_260 = (long)(int)uVar55;
                            scanline = pfVar34 + local_260;
                            local_2c0 = scanline + 1;
                            local_250 = local_260 * 4;
                            fVar76 = (float)(int)uVar55;
                            local_258 = (long)((int)local_3a8 + 2) << 2;
                            local_3b0 = (void *)0x0;
                            uVar29 = 0;
                            local_388 = (undefined8 *)0x0;
                            local_470 = 0;
                            psVar71 = (stbtt__active_edge *)0x0;
                            psVar72 = p_00;
                            do {
                              fVar79 = (float)iVar45;
                              fVar77 = fVar79 + 1.0;
                              local_248 = uVar29;
                              memset(pfVar34,0,local_250);
                              memset(scanline,0,local_258);
                              puVar57 = local_388;
                              if (local_3d0 != (undefined1  [8])0x0) {
                                auVar35 = local_3d0;
                                psVar37 = (stbtt__active_edge *)local_3d0;
                                do {
                                  psVar47 = (stbtt__active_edge *)auVar35;
                                  if (((stbtt__active_edge *)auVar35)->ey <= fVar79) {
                                    psVar37->next = ((stbtt__active_edge *)auVar35)->next;
                                    if ((((stbtt__active_edge *)auVar35)->direction == 0.0) &&
                                       (!NAN(((stbtt__active_edge *)auVar35)->direction))) {
                                      __assert_fail("z->direction",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x83b,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                    }
                                    ((stbtt__active_edge *)auVar35)->direction = 0.0;
                                    ((stbtt__active_edge *)auVar35)->next = psVar71;
                                    psVar47 = psVar37;
                                    psVar71 = (stbtt__active_edge *)auVar35;
                                  }
                                  auVar35 = (undefined1  [8])psVar47->next;
                                  psVar37 = psVar47;
                                } while (auVar35 != (undefined1  [8])0x0);
                              }
                              fVar80 = psVar72->y0;
                              while (pIVar14 = GImGui, fVar80 <= fVar77) {
                                psVar37 = psVar71;
                                if ((fVar80 != psVar72->y1) || (NAN(fVar80) || NAN(psVar72->y1))) {
                                  if (psVar71 == (stbtt__active_edge *)0x0) {
                                    if (local_470 == 0) {
                                      piVar1 = &(GImGui->IO).MetricsAllocs;
                                      *piVar1 = *piVar1 + 1;
                                      puVar36 = (undefined8 *)(*(pIVar14->IO).MemAllocFn)(0x6408);
                                      if (puVar36 == (undefined8 *)0x0) {
                                        psVar71 = (stbtt__active_edge *)0x0;
                                        goto LAB_00152889;
                                      }
                                      *puVar36 = puVar57;
                                      local_470 = 800;
                                      puVar57 = puVar36;
                                    }
                                    lVar56 = (long)(int)local_470;
                                    local_470 = local_470 + -1;
                                    psVar71 = (stbtt__active_edge *)(puVar57 + lVar56 * 4 + -4);
                                  }
                                  else {
                                    psVar37 = psVar71->next;
                                  }
LAB_00152889:
                                  if (psVar71 == (stbtt__active_edge *)0x0) {
                                    __assert_fail("z != __null",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x6ab,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                 );
                                  }
                                  fVar80 = psVar72->x0;
                                  fVar78 = psVar72->y0;
                                  fVar81 = psVar72->y1;
                                  fVar83 = (psVar72->x1 - fVar80) / (fVar81 - fVar78);
                                  psVar71->fdx = fVar83;
                                  psVar71->fdy = (float)(-(uint)(fVar83 != 0.0) &
                                                        (uint)(1.0 / fVar83));
                                  psVar71->fx = ((fVar79 - fVar78) * fVar83 + fVar80) -
                                                (float)iVar43;
                                  psVar71->direction =
                                       *(float *)(&DAT_00195798 + (ulong)(psVar72->invert == 0) * 4)
                                  ;
                                  psVar71->sy = fVar78;
                                  psVar71->ey = fVar81;
                                  psVar71->next = (stbtt__active_edge *)0x0;
                                  if (fVar81 < fVar79) {
                                    __assert_fail("z->ey >= scan_y_top",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x848,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  psVar71->next = (stbtt__active_edge *)local_3d0;
                                  local_3d0 = (undefined1  [8])psVar71;
                                }
                                psVar15 = psVar72 + 1;
                                psVar72 = psVar72 + 1;
                                psVar71 = psVar37;
                                fVar80 = psVar15->y0;
                              }
                              local_388 = puVar57;
                              for (auVar35 = local_3d0; auVar35 != (undefined1  [8])0x0;
                                  auVar35 = (undefined1  [8])((stbtt__active_edge *)auVar35)->next)
                              {
                                fVar80 = ((stbtt__active_edge *)auVar35)->ey;
                                if (fVar80 < fVar79) {
                                  __assert_fail("e->ey >= y_top",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                ,0x77f,
                                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                               );
                                }
                                fVar78 = ((stbtt__active_edge *)auVar35)->fx;
                                fVar81 = ((stbtt__active_edge *)auVar35)->fdx;
                                if ((fVar81 != 0.0) || (NAN(fVar81))) {
                                  fVar83 = ((stbtt__active_edge *)auVar35)->sy;
                                  if (fVar77 < fVar83) {
                                    __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x792,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  fVar86 = fVar81 + fVar78;
                                  fVar84 = (float)(~-(uint)(fVar79 < fVar83) & (uint)fVar78 |
                                                  (uint)((fVar83 - fVar79) * fVar81 + fVar78) &
                                                  -(uint)(fVar79 < fVar83));
                                  if ((((fVar84 < 0.0) ||
                                       (fVar85 = (float)(~-(uint)(fVar80 < fVar77) & (uint)fVar86 |
                                                        (uint)((fVar80 - fVar79) * fVar81 + fVar78)
                                                        & -(uint)(fVar80 < fVar77)), fVar85 < 0.0))
                                      || (fVar76 <= fVar84)) || (fVar76 <= fVar85)) {
                                    if ((uint)local_3a8._0_4_ < 0x7fffffff) {
                                      local_3c8 = ZEXT416((uint)fVar86);
                                      local_3a0 = (uchar *)CONCAT44(local_3a0._4_4_,fVar81);
                                      uVar26 = 0;
                                      do {
                                        fVar80 = (float)(int)uVar26;
                                        uVar42 = uVar26 + 1;
                                        fVar84 = (float)(int)uVar42;
                                        fVar83 = (fVar80 - fVar78) / fVar81 + fVar79;
                                        fVar81 = (fVar84 - fVar78) / fVar81 + fVar79;
                                        if ((fVar80 <= fVar78) || (fVar86 <= fVar84)) {
                                          if ((fVar86 < fVar80) && (fVar84 < fVar78)) {
                                            stbtt__handle_clipped_edge
                                                      (pfVar34,uVar26,(stbtt__active_edge *)auVar35,
                                                       fVar78,fVar79,fVar84,fVar81);
                                            fVar85 = fVar84;
                                            fVar82 = fVar81;
LAB_00152c5a:
                                            stbtt__handle_clipped_edge
                                                      (pfVar34,uVar26,(stbtt__active_edge *)auVar35,
                                                       fVar85,fVar82,fVar80,fVar83);
                                            goto LAB_00152c74;
                                          }
                                          fVar85 = fVar78;
                                          fVar82 = fVar79;
                                          if (((fVar78 < fVar80) && (fVar80 < fVar86)) ||
                                             ((fVar86 < fVar80 && (fVar80 < fVar78))))
                                          goto LAB_00152c5a;
                                          fVar80 = fVar78;
                                          fVar83 = fVar79;
                                          if (((fVar78 < fVar84) && (fVar84 < fVar86)) ||
                                             ((fVar86 < fVar84 && (fVar84 < fVar78))))
                                          goto LAB_00152bc0;
                                        }
                                        else {
                                          stbtt__handle_clipped_edge
                                                    (pfVar34,uVar26,(stbtt__active_edge *)auVar35,
                                                     fVar78,fVar79,fVar80,fVar83);
LAB_00152bc0:
                                          stbtt__handle_clipped_edge
                                                    (pfVar34,uVar26,(stbtt__active_edge *)auVar35,
                                                     fVar80,fVar83,fVar84,fVar81);
                                          fVar80 = fVar84;
                                          fVar83 = fVar81;
LAB_00152c74:
                                          fVar86 = (float)local_3c8._0_4_;
                                        }
                                        stbtt__handle_clipped_edge
                                                  (pfVar34,uVar26,(stbtt__active_edge *)auVar35,
                                                   fVar80,fVar83,fVar86,fVar77);
                                        fVar81 = local_3a0._0_4_;
                                        fVar86 = (float)local_3c8._0_4_;
                                        uVar26 = uVar42;
                                      } while (uVar55 != uVar42);
                                    }
                                  }
                                  else {
                                    if (fVar83 <= fVar79) {
                                      fVar83 = fVar79;
                                    }
                                    uVar26 = (uint)fVar84;
                                    if (fVar77 <= fVar80) {
                                      fVar80 = fVar77;
                                    }
                                    if (uVar26 == (int)fVar85) {
                                      if (((int)uVar26 < 0) || ((int)uVar55 <= (int)uVar26)) {
                                        __assert_fail("x >= 0 && x < len",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x7ae,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar29 = (ulong)uVar26;
                                      pfVar34[uVar29] =
                                           (((fVar85 - (float)(int)uVar26) +
                                            (fVar84 - (float)(int)uVar26)) * -0.5 + 1.0) *
                                           ((stbtt__active_edge *)auVar35)->direction *
                                           (fVar80 - fVar83) + pfVar34[uVar29];
                                      fVar78 = (fVar80 - fVar83) *
                                               ((stbtt__active_edge *)auVar35)->direction;
                                    }
                                    else {
                                      fVar81 = ((stbtt__active_edge *)auVar35)->fdy;
                                      fVar82 = fVar85;
                                      if (fVar85 < fVar84) {
                                        fVar78 = fVar79 - fVar83;
                                        fVar83 = (fVar79 - fVar80) + fVar77;
                                        fVar81 = -fVar81;
                                        fVar80 = fVar78 + fVar77;
                                        fVar82 = fVar84;
                                        fVar78 = fVar86;
                                        fVar84 = fVar85;
                                      }
                                      iVar63 = (int)fVar82;
                                      iVar61 = (int)fVar84 + 1;
                                      fVar85 = ((float)iVar61 - fVar78) * fVar81 + fVar79;
                                      fVar78 = ((stbtt__active_edge *)auVar35)->direction;
                                      fVar86 = (fVar85 - fVar83) * fVar78;
                                      lVar56 = (long)(int)fVar84;
                                      pfVar34[lVar56] =
                                           (((fVar84 - (float)(int)fVar84) + 1.0) * -0.5 + 1.0) *
                                           fVar86 + pfVar34[lVar56];
                                      if (iVar63 - iVar61 != 0 && iVar61 <= iVar63) {
                                        do {
                                          pfVar34[lVar56 + 1] =
                                               fVar81 * fVar78 * 0.5 + fVar86 + pfVar34[lVar56 + 1];
                                          fVar86 = fVar86 + fVar81 * fVar78;
                                          lVar56 = lVar56 + 1;
                                        } while (iVar63 + -1 != (int)lVar56);
                                      }
                                      if (1.01 < ABS(fVar86)) {
                                        __assert_fail("fabs(area) <= 1.01f",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x7d3,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar29 = (ulong)iVar63;
                                      pfVar34[uVar29] =
                                           (fVar80 - (fVar81 * (float)(iVar63 - iVar61) + fVar85)) *
                                           (((fVar82 - (float)iVar63) + 0.0) * -0.5 + 1.0) * fVar78
                                           + fVar86 + pfVar34[uVar29];
                                      fVar78 = (fVar80 - fVar83) * fVar78;
                                    }
                                    local_2c0[uVar29] = fVar78 + local_2c0[uVar29];
                                  }
                                }
                                else if (fVar78 < fVar76) {
                                  if (0.0 <= fVar78) {
                                    stbtt__handle_clipped_edge
                                              (pfVar34,(int)fVar78,(stbtt__active_edge *)auVar35,
                                               fVar78,fVar79,fVar78,fVar77);
                                    iVar61 = (int)fVar78 + 1;
                                  }
                                  else {
                                    iVar61 = 0;
                                  }
                                  stbtt__handle_clipped_edge
                                            (scanline,iVar61,(stbtt__active_edge *)auVar35,fVar78,
                                             fVar79,fVar78,fVar77);
                                }
                              }
                              auVar35 = local_3d0;
                              if ((uint)local_3a8._0_4_ < 0x7fffffff) {
                                fVar79 = 0.0;
                                pfVar38 = pfVar34;
                                pvVar68 = local_3b0;
                                lVar56 = local_260;
                                do {
                                  fVar79 = fVar79 + pfVar38[local_260];
                                  iVar61 = (int)(ABS(*pfVar38 + fVar79) * 255.0 + 0.5);
                                  uVar54 = (uchar)iVar61;
                                  if (0xfe < iVar61) {
                                    uVar54 = 0xff;
                                  }
                                  local_2c8[(int)pvVar68] = uVar54;
                                  pvVar68 = (void *)(ulong)((int)pvVar68 + 1);
                                  pfVar38 = pfVar38 + 1;
                                  lVar56 = lVar56 + -1;
                                } while (lVar56 != 0);
                              }
                              for (; auVar35 != (undefined1  [8])0x0;
                                  auVar35 = (undefined1  [8])((stbtt__active_edge *)auVar35)->next)
                              {
                                ((stbtt__active_edge *)auVar35)->fx =
                                     ((stbtt__active_edge *)auVar35)->fdx +
                                     ((stbtt__active_edge *)auVar35)->fx;
                              }
                              iVar45 = iVar45 + 1;
                              uVar29 = (ulong)((uint)local_248 + 1);
                              local_3b0 = (void *)(ulong)((int)local_3b0 + local_374);
                              pIVar14 = GImGui;
                              puVar57 = local_388;
                            } while ((uint)local_248 != uVar44);
                          }
                          else {
                            local_388 = (undefined8 *)0x0;
                            pIVar14 = GImGui;
                            puVar57 = local_388;
                          }
                          while (GImGui = pIVar14, puVar57 != (undefined8 *)0x0) {
                            puVar36 = (undefined8 *)*puVar57;
                            piVar1 = &(pIVar14->IO).MetricsAllocs;
                            *piVar1 = *piVar1 + -1;
                            (*(pIVar14->IO).MemFreeFn)(puVar57);
                            pIVar14 = GImGui;
                            puVar57 = puVar36;
                          }
                          if (pfVar34 != (float *)&local_238) {
                            if (pfVar34 != (float *)0x0) {
                              piVar1 = &(pIVar14->IO).MetricsAllocs;
                              *piVar1 = *piVar1 + -1;
                            }
                            (*(GImGui->IO).MemFreeFn)(pfVar34);
                          }
                          pIVar14 = GImGui;
                          piVar1 = &(GImGui->IO).MetricsAllocs;
                          *piVar1 = *piVar1 + -1;
                          (*(pIVar14->IO).MemFreeFn)(p_00);
                        }
                        if (pvVar33 != (void *)0x0) {
                          piVar1 = &(GImGui->IO).MetricsAllocs;
                          *piVar1 = *piVar1 + -1;
                        }
                        (*(GImGui->IO).MemFreeFn)(pvVar33);
                        pIVar14 = GImGui;
                        piVar1 = &(GImGui->IO).MetricsAllocs;
                        *piVar1 = *piVar1 + -1;
                        (*(pIVar14->IO).MemFreeFn)(local_300);
                      }
                    }
                  }
                  if ((void *)CONCAT44(local_320._4_4_,(int)local_320) != (void *)0x0) {
                    piVar1 = &(GImGui->IO).MetricsAllocs;
                    *piVar1 = *piVar1 + -1;
                  }
                  (*(GImGui->IO).MemFreeFn)((void *)CONCAT44(local_320._4_4_,(int)local_320));
                  uVar26 = local_370.h_oversample;
                  uVar29 = local_370._32_8_ & 0xffffffff;
                  if (1 < uVar29) {
                    lVar56 = (long)local_370.stride_in_bytes;
                    uVar17 = *(ushort *)(local_308 + 4);
                    uVar41 = *(ushort *)(local_308 + 6);
                    local_238 = 0;
                    if (uVar41 != 0) {
                      puVar32 = local_370.pixels +
                                (ulong)*(ushort *)(local_308 + 10) * lVar56 +
                                (ulong)*(ushort *)(local_308 + 8);
                      iVar45 = uVar17 - local_370.h_oversample;
                      uVar65 = (ulong)(iVar45 + 1);
                      uVar42 = 0;
                      do {
                        memset(&local_238,0,uVar29);
                        switch(uVar26) {
                        case 2:
                          if (iVar45 < 0) {
LAB_001532de:
                            uVar46 = 0;
                            uVar55 = 0;
                          }
                          else {
                            uVar46 = 0;
                            uVar55 = 0;
                            do {
                              bVar2 = puVar32[uVar46];
                              bVar4 = *(byte *)((long)&local_238 + (ulong)((uint)uVar46 & 7));
                              *(byte *)((long)&local_238 + (ulong)((uint)uVar46 + 2 & 7)) = bVar2;
                              uVar55 = uVar55 + ((uint)bVar2 - (uint)bVar4);
                              puVar32[uVar46] = (uchar)(uVar55 >> 1);
                              uVar46 = uVar46 + 1;
                            } while (uVar65 != uVar46);
                          }
                          break;
                        case 3:
                          if (iVar45 < 0) goto LAB_001532de;
                          uVar46 = 0;
                          uVar55 = 0;
                          do {
                            bVar2 = puVar32[uVar46];
                            bVar4 = *(byte *)((long)&local_238 + (ulong)((uint)uVar46 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar46 + 3 & 7)) = bVar2;
                            uVar55 = uVar55 + ((uint)bVar2 - (uint)bVar4);
                            puVar32[uVar46] = (uchar)(uVar55 / 3);
                            uVar46 = uVar46 + 1;
                          } while (uVar65 != uVar46);
                          break;
                        case 4:
                          if (iVar45 < 0) goto LAB_001532de;
                          uVar46 = 0;
                          uVar55 = 0;
                          do {
                            bVar2 = puVar32[uVar46];
                            uVar51 = (ulong)((uint)uVar46 & 7);
                            *(byte *)((long)&local_238 + (uVar51 ^ 4)) = bVar2;
                            uVar55 = uVar55 + ((uint)bVar2 -
                                              (uint)*(byte *)((long)&local_238 + uVar51));
                            puVar32[uVar46] = (uchar)(uVar55 >> 2);
                            uVar46 = uVar46 + 1;
                          } while (uVar65 != uVar46);
                          break;
                        case 5:
                          if (iVar45 < 0) goto LAB_001532de;
                          uVar46 = 0;
                          uVar55 = 0;
                          do {
                            bVar2 = puVar32[uVar46];
                            bVar4 = *(byte *)((long)&local_238 + (ulong)((uint)uVar46 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar46 + 5 & 7)) = bVar2;
                            uVar55 = uVar55 + ((uint)bVar2 - (uint)bVar4);
                            puVar32[uVar46] = (uchar)(uVar55 / 5);
                            uVar46 = uVar46 + 1;
                          } while (uVar65 != uVar46);
                          break;
                        default:
                          if (iVar45 < 0) goto LAB_001532de;
                          uVar46 = 0;
                          uVar55 = 0;
                          do {
                            bVar2 = puVar32[uVar46];
                            bVar4 = *(byte *)((long)&local_238 + (ulong)((uint)uVar46 & 7));
                            *(byte *)((long)&local_238 + (ulong)(uVar26 + (uint)uVar46 & 7)) = bVar2
                            ;
                            uVar55 = uVar55 + ((uint)bVar2 - (uint)bVar4);
                            puVar32[uVar46] = (uchar)(uVar55 / uVar26);
                            uVar46 = uVar46 + 1;
                          } while (uVar65 != uVar46);
                        }
                        if ((int)uVar46 < (int)(uint)uVar17) {
                          uVar46 = uVar46 & 0xffffffff;
                          do {
                            if (puVar32[uVar46] != '\0') {
                              __assert_fail("pixels[i] == 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                            ,0xada,
                                            "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                           );
                            }
                            uVar55 = uVar55 - *(byte *)((long)&local_238 + (ulong)((uint)uVar46 & 7)
                                                       );
                            puVar32[uVar46] = (uchar)(uVar55 / uVar26);
                            uVar46 = uVar46 + 1;
                          } while ((int)uVar46 < (int)(uint)uVar17);
                        }
                        puVar32 = puVar32 + lVar56;
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar41);
                    }
                  }
                  uVar26 = local_370.v_oversample;
                  uVar29 = (ulong)local_370.v_oversample;
                  if (1 < uVar29) {
                    lVar56 = (long)local_370.stride_in_bytes;
                    uVar17 = *(ushort *)(local_308 + 4);
                    uVar42 = (uint)*(ushort *)(local_308 + 6);
                    local_238 = 0;
                    if (uVar17 != 0) {
                      pbVar73 = local_370.pixels +
                                (ulong)*(ushort *)(local_308 + 10) * lVar56 +
                                (ulong)*(ushort *)(local_308 + 8);
                      iVar45 = uVar42 - local_370.v_oversample;
                      uVar65 = (ulong)(iVar45 + 1);
                      uVar55 = 0;
                      do {
                        memset(&local_238,0,uVar29);
                        switch(uVar26) {
                        case 2:
                          if (iVar45 < 0) {
LAB_00153554:
                            uVar46 = 0;
                            uVar44 = 0;
                          }
                          else {
                            uVar46 = 0;
                            uVar44 = 0;
                            pbVar60 = pbVar73;
                            do {
                              bVar2 = *pbVar60;
                              bVar4 = *(byte *)((long)&local_238 + (ulong)((uint)uVar46 & 7));
                              *(byte *)((long)&local_238 + (ulong)((uint)uVar46 + 2 & 7)) = bVar2;
                              uVar44 = uVar44 + ((uint)bVar2 - (uint)bVar4);
                              *pbVar60 = (byte)(uVar44 >> 1);
                              uVar46 = uVar46 + 1;
                              pbVar60 = pbVar60 + lVar56;
                            } while (uVar65 != uVar46);
                          }
                          break;
                        case 3:
                          if (iVar45 < 0) goto LAB_00153554;
                          uVar46 = 0;
                          uVar44 = 0;
                          pbVar60 = pbVar73;
                          do {
                            bVar2 = *pbVar60;
                            bVar4 = *(byte *)((long)&local_238 + (ulong)((uint)uVar46 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar46 + 3 & 7)) = bVar2;
                            uVar44 = uVar44 + ((uint)bVar2 - (uint)bVar4);
                            *pbVar60 = (byte)(uVar44 / 3);
                            uVar46 = uVar46 + 1;
                            pbVar60 = pbVar60 + lVar56;
                          } while (uVar65 != uVar46);
                          break;
                        case 4:
                          if (iVar45 < 0) goto LAB_00153554;
                          uVar46 = 0;
                          uVar44 = 0;
                          pbVar60 = pbVar73;
                          do {
                            bVar2 = *pbVar60;
                            uVar51 = (ulong)((uint)uVar46 & 7);
                            *(byte *)((long)&local_238 + (uVar51 ^ 4)) = bVar2;
                            uVar44 = uVar44 + ((uint)bVar2 -
                                              (uint)*(byte *)((long)&local_238 + uVar51));
                            *pbVar60 = (byte)(uVar44 >> 2);
                            uVar46 = uVar46 + 1;
                            pbVar60 = pbVar60 + lVar56;
                          } while (uVar65 != uVar46);
                          break;
                        case 5:
                          if (iVar45 < 0) goto LAB_00153554;
                          uVar46 = 0;
                          uVar44 = 0;
                          pbVar60 = pbVar73;
                          do {
                            bVar2 = *pbVar60;
                            bVar4 = *(byte *)((long)&local_238 + (ulong)((uint)uVar46 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar46 + 5 & 7)) = bVar2;
                            uVar44 = uVar44 + ((uint)bVar2 - (uint)bVar4);
                            *pbVar60 = (byte)(uVar44 / 5);
                            uVar46 = uVar46 + 1;
                            pbVar60 = pbVar60 + lVar56;
                          } while (uVar65 != uVar46);
                          break;
                        default:
                          if (iVar45 < 0) goto LAB_00153554;
                          uVar46 = 0;
                          uVar44 = 0;
                          pbVar60 = pbVar73;
                          do {
                            bVar2 = *pbVar60;
                            bVar4 = *(byte *)((long)&local_238 + (ulong)((uint)uVar46 & 7));
                            *(byte *)((long)&local_238 + (ulong)(uVar26 + (uint)uVar46 & 7)) = bVar2
                            ;
                            uVar44 = uVar44 + ((uint)bVar2 - (uint)bVar4);
                            *pbVar60 = (byte)(uVar44 / uVar26);
                            uVar46 = uVar46 + 1;
                            pbVar60 = pbVar60 + lVar56;
                          } while (uVar65 != uVar46);
                        }
                        iVar43 = (int)uVar46;
                        iVar61 = uVar42 - iVar43;
                        if (iVar61 != 0 && iVar43 <= (int)uVar42) {
                          lVar49 = (long)iVar43;
                          pbVar60 = pbVar73 + lVar56 * lVar49;
                          do {
                            if (*pbVar60 != 0) {
                              __assert_fail("pixels[i*stride_in_bytes] == 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                            ,0xb18,
                                            "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                           );
                            }
                            uVar44 = uVar44 - *(byte *)((long)&local_238 + (ulong)((uint)lVar49 & 7)
                                                       );
                            *pbVar60 = (byte)(uVar44 / uVar26);
                            lVar49 = lVar49 + 1;
                            pbVar60 = pbVar60 + lVar56;
                            iVar61 = iVar61 + -1;
                          } while (iVar61 != 0);
                        }
                        pbVar73 = pbVar73 + 1;
                        uVar55 = uVar55 + 1;
                      } while (uVar55 != uVar17);
                    }
                  }
                  sVar18 = (short)*(undefined4 *)(local_308 + 8);
                  *local_278 = sVar18;
                  sVar5 = *(short *)(local_308 + 10);
                  local_278[1] = sVar5;
                  uVar17 = *(ushort *)(local_308 + 4);
                  local_278[2] = sVar18 + uVar17;
                  uVar41 = *(ushort *)(local_308 + 6);
                  local_278[3] = sVar5 + uVar41;
                  *(float *)(local_278 + 8) =
                       (float)(int)(short)((short)(local_2e0 << 8) + (short)local_2e4) * local_2b8;
                  *(float *)(local_278 + 4) = (float)local_2d8 * local_2e8 + local_37c;
                  *(float *)(local_278 + 6) = (float)local_2dc * local_2ec + local_378;
                  *(float *)(local_278 + 10) =
                       (float)(int)(local_2d8 + (uint)uVar17) * local_2e8 + local_37c;
                  *(float *)(local_278 + 0xc) =
                       (float)(int)(local_2dc + (uint)uVar41) * local_2ec + local_378;
                  lVar48 = local_270;
                  lVar50 = local_280;
                  lVar56 = local_288;
                  lVar49 = local_268;
                  fVar76 = local_37c;
                }
                lVar49 = lVar49 + 1;
                lVar48 = lVar48 + 1;
              } while (lVar48 < *(int *)(lVar50 + 0x10));
            }
            lVar48 = local_290 + 1;
          } while (lVar48 != local_298);
        }
        local_370.v_oversample = local_2f4;
        local_370.h_oversample = local_2f0;
        local_390[1].userdata = (void *)0x0;
        lVar56 = local_2a0 + 1;
      } while (lVar56 < (this->ConfigData).Size);
    }
    if ((stbrp_node *)local_370.nodes != (stbrp_node *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(local_370.nodes);
    if ((stbrp_context *)local_370.pack_info != (stbrp_context *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(local_370.pack_info);
    if (local_330 != (void *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(local_330);
    if (0 < (this->ConfigData).Size) {
      lVar56 = 0;
      do {
        pIVar58 = (this->ConfigData).Data;
        pIVar7 = pIVar58 + lVar56;
        lVar50 = lVar56 * 0x50;
        pIVar8 = pIVar58[lVar56].DstFont;
        fVar76 = pIVar58[lVar56].SizePixels;
        lVar49 = *(long *)((long)pvVar28 + lVar50 + 8);
        lVar48 = (long)*(int *)((long)pvVar28 + lVar50 + 0x24);
        uVar42 = (int)(short)((ushort)*(byte *)(lVar49 + 4 + lVar48) << 8) |
                 (uint)*(byte *)(lVar49 + 5 + lVar48);
        uVar26 = (int)(short)((ushort)*(byte *)(lVar49 + 6 + lVar48) << 8) |
                 (uint)*(byte *)(lVar49 + 7 + lVar48);
        fVar79 = fVar76 / (float)(int)(uVar42 - uVar26);
        fVar77 = (float)(int)uVar42 * fVar79;
        if (pIVar58[lVar56].MergeMode == false) {
          pIVar8->ContainerAtlas = this;
          pIVar8->ConfigData = pIVar7;
          pIVar8->ConfigDataCount = 0;
          pIVar8->FontSize = fVar76;
          pIVar8->Ascent = fVar77;
          pIVar8->Descent = fVar79 * (float)(int)(short)uVar26;
          pIVar14 = GImGui;
          iVar45 = (pIVar8->Glyphs).Capacity;
          if (iVar45 < 0) {
            uVar26 = iVar45 / 2 + iVar45;
            if ((int)uVar26 < 1) {
              uVar26 = 0;
            }
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + 1;
            pGVar39 = (Glyph *)(*(pIVar14->IO).MemAllocFn)((ulong)uVar26 * 0x28);
            pGVar40 = (pIVar8->Glyphs).Data;
            if (pGVar40 != (Glyph *)0x0) {
              memcpy(pGVar39,pGVar40,(long)(pIVar8->Glyphs).Size * 0x28);
            }
            pGVar40 = (pIVar8->Glyphs).Data;
            if (pGVar40 != (Glyph *)0x0) {
              piVar1 = &(GImGui->IO).MetricsAllocs;
              *piVar1 = *piVar1 + -1;
            }
            (*(GImGui->IO).MemFreeFn)(pGVar40);
            (pIVar8->Glyphs).Data = pGVar39;
            (pIVar8->Glyphs).Capacity = uVar26;
          }
          (pIVar8->Glyphs).Size = 0;
        }
        pIVar8->ConfigDataCount = pIVar8->ConfigDataCount + 1;
        fVar76 = 0.0;
        if ((pIVar7->MergeMode == true) && (pIVar7->MergeGlyphCenterV == true)) {
          fVar76 = (fVar77 - pIVar8->Ascent) * 0.5;
        }
        pIVar8->FallbackGlyph = (Glyph *)0x0;
        if (0 < *(int *)(lVar50 + (long)pvVar28 + 0x48)) {
          lVar49 = 0;
          local_3a8 = (void *)CONCAT44(local_3a8._4_4_,fVar76);
          local_3b0 = (void *)(lVar50 + (long)pvVar28);
          do {
            if (0 < *(int *)(*(long *)((long)local_3b0 + 0x40) + 0x10 + lVar49 * 0x28)) {
              lVar48 = *(long *)((long)local_3b0 + 0x40) + lVar49 * 0x28;
              lVar50 = 0;
              lVar74 = 0;
              do {
                pIVar14 = GImGui;
                lVar12 = *(long *)(lVar48 + 0x18);
                if ((((*(short *)(lVar12 + lVar50) != 0) || (*(short *)(lVar12 + 4 + lVar50) != 0))
                    || (*(short *)(lVar12 + 2 + lVar50) != 0)) ||
                   (*(short *)(lVar12 + 6 + lVar50) != 0)) {
                  uVar26 = *(uint *)(lVar48 + 4);
                  if (pIVar7->MergeMode == true) {
                    uVar29 = lVar74 + (ulong)uVar26;
                    if (((int)((uint)uVar29 & 0xffff) < (pIVar8->IndexLookup).Size) &&
                       (uVar17 = (pIVar8->IndexLookup).Data[uVar29 & 0xffff], uVar17 != 0xffff)) {
                      pGVar40 = (Glyph *)((long)&((pIVar8->Glyphs).Data)->Codepoint +
                                         (ulong)((uint)uVar17 * 0x28));
                    }
                    else {
                      pGVar40 = pIVar8->FallbackGlyph;
                    }
                    if (pGVar40 != (Glyph *)0x0) goto LAB_00153d11;
                  }
                  fVar79 = *(float *)(lVar12 + 8 + lVar50);
                  fVar80 = *(float *)(lVar12 + 0xc + lVar50) + 0.0;
                  fVar77 = *(float *)(lVar12 + 0x14 + lVar50);
                  iVar45 = this->TexHeight;
                  fVar78 = *(float *)(lVar12 + 0x18 + lVar50) + 0.0;
                  iVar43 = this->TexWidth;
                  uVar17 = *(ushort *)(lVar12 + lVar50);
                  uVar41 = *(ushort *)(lVar12 + 2 + lVar50);
                  uVar52 = *(ushort *)(lVar12 + 4 + lVar50);
                  uVar6 = *(ushort *)(lVar12 + 6 + lVar50);
                  iVar61 = (pIVar8->Glyphs).Size;
                  iVar63 = (pIVar8->Glyphs).Capacity;
                  uVar42 = iVar61 + 1;
                  uVar55 = (uint)uVar6;
                  if (iVar63 <= iVar61) {
                    if (iVar63 == 0) {
                      uVar44 = 8;
                    }
                    else {
                      uVar44 = iVar63 / 2 + iVar63;
                    }
                    if ((int)uVar44 <= (int)uVar42) {
                      uVar44 = uVar42;
                    }
                    if (iVar63 < (int)uVar44) {
                      local_3a0 = (uchar *)CONCAT44(local_3a0._4_4_,(uint)uVar6);
                      local_3c8._0_4_ = fVar80;
                      piVar1 = &(GImGui->IO).MetricsAllocs;
                      *piVar1 = *piVar1 + 1;
                      pGVar39 = (Glyph *)(*(pIVar14->IO).MemAllocFn)((long)(int)uVar44 * 0x28);
                      pGVar40 = (pIVar8->Glyphs).Data;
                      if (pGVar40 != (Glyph *)0x0) {
                        memcpy(pGVar39,pGVar40,(long)(pIVar8->Glyphs).Size * 0x28);
                      }
                      pGVar40 = (pIVar8->Glyphs).Data;
                      if (pGVar40 != (Glyph *)0x0) {
                        piVar1 = &(GImGui->IO).MetricsAllocs;
                        *piVar1 = *piVar1 + -1;
                      }
                      (*(GImGui->IO).MemFreeFn)(pGVar40);
                      (pIVar8->Glyphs).Data = pGVar39;
                      (pIVar8->Glyphs).Capacity = uVar44;
                      fVar76 = local_3a8._0_4_;
                      fVar80 = (float)local_3c8._0_4_;
                      uVar55 = (uint)local_3a0._0_4_;
                    }
                  }
                  (pIVar8->Glyphs).Size = uVar42;
                  if (iVar61 < 0) {
                    __assert_fail("Size > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                                  ,0x35d,
                                  "value_type &ImVector<ImFont::Glyph>::back() [T = ImFont::Glyph]")
                    ;
                  }
                  fVar81 = 1.0 / (float)iVar45;
                  fVar83 = 1.0 / (float)iVar43;
                  pGVar40 = (pIVar8->Glyphs).Data;
                  pGVar40[(ulong)uVar42 - 1].Codepoint = (short)uVar26 + (short)lVar74;
                  pGVar40[(ulong)uVar42 - 1].X0 = fVar79 + 0.0;
                  pGVar40[(ulong)uVar42 - 1].Y0 = fVar80;
                  pGVar40[(ulong)uVar42 - 1].X1 = fVar77 + 0.0;
                  pGVar40[(ulong)uVar42 - 1].Y1 = fVar78;
                  pGVar40[(ulong)uVar42 - 1].U0 = (float)uVar17 * fVar83;
                  pGVar40[(ulong)uVar42 - 1].V0 = (float)uVar41 * fVar81;
                  pGVar40[(ulong)uVar42 - 1].U1 = (float)uVar52 * fVar83;
                  pGVar40[(ulong)uVar42 - 1].V1 = (float)(int)uVar55 * fVar81;
                  fVar79 = (float)(int)(pIVar8->Ascent + fVar76 + 0.5);
                  pGVar40[(ulong)uVar42 - 1].Y0 = fVar80 + fVar79;
                  pGVar40[(ulong)uVar42 - 1].Y1 = fVar78 + fVar79;
                  fVar79 = *(float *)(lVar12 + 0x10 + lVar50) + (pIVar7->GlyphExtraSpacing).x;
                  pGVar40[(ulong)uVar42 - 1].XAdvance = fVar79;
                  if (pIVar7->PixelSnapH == true) {
                    pGVar40[(ulong)uVar42 - 1].XAdvance = (float)(int)(fVar79 + 0.5);
                  }
                }
LAB_00153d11:
                lVar74 = lVar74 + 1;
                lVar50 = lVar50 + 0x1c;
              } while (lVar74 < *(int *)(lVar48 + 0x10));
            }
            lVar49 = lVar49 + 1;
          } while (lVar49 < *(int *)((long)local_3b0 + 0x48));
        }
        ImFont::BuildLookupTable(pIVar7->DstFont);
        lVar56 = lVar56 + 1;
      } while (lVar56 < (this->ConfigData).Size);
    }
    if (local_328 != (void *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(local_328);
    if (local_338 != (void *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(local_338);
    if (pvVar28 != (void *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(pvVar28);
    RenderCustomTexData(this,1,&local_318);
    ImVector<stbrp_rect>::~ImVector(&local_318);
  }
  return bVar75;
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(ConfigData.Size > 0);

    TexID = NULL;
    TexWidth = TexHeight = 0;
    TexUvWhitePixel = ImVec2(0, 0);
    ClearTexData();

    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)ConfigData.Size * sizeof(ImFontTempBuildData));

    // Initialize font information early (so we can error without any cleanup) + count glyphs
    int total_glyph_count = 0;
    int total_glyph_range_count = 0;
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this));
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0);
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Count glyphs
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            total_glyph_count += (in_range[1] - in_range[0]) + 1;
            total_glyph_range_count++;
        }
    }

    // Start packing. We need a known width for the skyline algorithm. Using a cheap heuristic here to decide of width. User can override TexDesiredWidth if they wish.
    // After packing is done, width shouldn't matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    TexWidth = (TexDesiredWidth > 0) ? TexDesiredWidth : (total_glyph_count > 4000) ? 4096 : (total_glyph_count > 2000) ? 2048 : (total_glyph_count > 1000) ? 1024 : 512;
    TexHeight = 0;
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc;
    stbtt_PackBegin(&spc, NULL, TexWidth, max_tex_height, 0, 1, NULL);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImVector<stbrp_rect> extra_rects;
    RenderCustomTexData(0, &extra_rects);
    stbtt_PackSetOversampling(&spc, 1, 1);
    stbrp_pack_rects((stbrp_context*)spc.pack_info, &extra_rects[0], extra_rects.Size);
    for (int i = 0; i < extra_rects.Size; i++)
        if (extra_rects[i].was_packed)
            TexHeight = ImMax(TexHeight, extra_rects[i].y + extra_rects[i].h);

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyph_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyph_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_glyph_range_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyph_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyph_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_glyph_range_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int glyph_count = 0;
        int glyph_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            glyph_count += (in_range[1] - in_range[0]) + 1;
            glyph_ranges_count++;
        }
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = glyph_ranges_count;
        buf_ranges_n += glyph_ranges_count;
        for (int i = 0; i < glyph_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Pack
        tmp.Rects = buf_rects + buf_rects_n;
        buf_rects_n += glyph_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        for (int i = 0; i < n; i++)
            if (tmp.Rects[i].was_packed)
                TexHeight = ImMax(TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
    }
    IM_ASSERT(buf_rects_n == total_glyph_count);
    IM_ASSERT(buf_packedchars_n == total_glyph_count);
    IM_ASSERT(buf_ranges_n == total_glyph_range_count);

    // Create texture
    TexHeight = ImUpperPowerOfTwo(TexHeight);
    TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(TexWidth * TexHeight);
    memset(TexPixelsAlpha8, 0, TexWidth * TexHeight);
    spc.pixels = TexPixelsAlpha8;
    spc.height = TexHeight;

    // Second pass: render characters
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont;

        float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        float ascent = unscaled_ascent * font_scale;
        float descent = unscaled_descent * font_scale;
        if (!cfg.MergeMode)
        {
            dst_font->ContainerAtlas = this;
            dst_font->ConfigData = &cfg;
            dst_font->ConfigDataCount = 0;
            dst_font->FontSize = cfg.SizePixels;
            dst_font->Ascent = ascent;
            dst_font->Descent = descent;
            dst_font->Glyphs.resize(0);
        }
        dst_font->ConfigDataCount++;
        float off_y = (cfg.MergeMode && cfg.MergeGlyphCenterV) ? (ascent - dst_font->Ascent) * 0.5f : 0.0f;

        dst_font->FallbackGlyph = NULL; // Always clear fallback so FindGlyph can return NULL. It will be set again in BuildLookupTable()
        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyph((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, TexWidth, TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);

                dst_font->Glyphs.resize(dst_font->Glyphs.Size + 1);
                ImFont::Glyph& glyph = dst_font->Glyphs.back();
                glyph.Codepoint = (ImWchar)codepoint;
                glyph.X0 = q.x0; glyph.Y0 = q.y0; glyph.X1 = q.x1; glyph.Y1 = q.y1;
                glyph.U0 = q.s0; glyph.V0 = q.t0; glyph.U1 = q.s1; glyph.V1 = q.t1;
                glyph.Y0 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.Y1 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.XAdvance = (pc.xadvance + cfg.GlyphExtraSpacing.x);  // Bake spacing into XAdvance
                if (cfg.PixelSnapH)
                    glyph.XAdvance = (float)(int)(glyph.XAdvance + 0.5f);
            }
        }
        cfg.DstFont->BuildLookupTable();
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    // Render into our custom data block
    RenderCustomTexData(1, &extra_rects);

    return true;
}